

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O0

int Llb_NonlinFindBestVar(DdManager *dd,DdNode *bFunc,Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  uint uVar1;
  int iVar2;
  int b;
  int iVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Aig_Obj_t *pAVar7;
  DdNode *pDVar8;
  DdNode *n;
  abctime aVar9;
  abctime clk;
  int Size1;
  int Size0;
  int Size;
  int Size0Best;
  int iValueBest;
  int iValue;
  int iVarBest;
  int iVar;
  int i;
  DdNode *bVar;
  DdNode *bCof;
  Aig_Obj_t *pObj;
  int fVerbose;
  Aig_Man_t *pAig_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  iValueBest = -1;
  Size = 1000000000;
  Size0 = -1;
  aVar6 = Abc_Clock();
  uVar1 = Cudd_DagSize(bFunc);
  for (iVarBest = 0; iVar2 = Saig_ManRegNum(pAig), iVarBest < iVar2; iVarBest = iVarBest + 1) {
    p = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p,iVarBest + iVar2);
    iVar2 = Aig_ObjId(pAVar7);
    pDVar8 = Cudd_bddIthVar(dd,iVar2);
    n = Cudd_bddAnd(dd,bFunc,(DdNode *)((ulong)pDVar8 ^ 1));
    Cudd_Ref(n);
    iVar2 = Cudd_DagSize(n);
    Cudd_RecursiveDeref(dd,n);
    pDVar8 = Cudd_bddAnd(dd,bFunc,pDVar8);
    Cudd_Ref(pDVar8);
    b = Cudd_DagSize(pDVar8);
    Cudd_RecursiveDeref(dd,pDVar8);
    iVar3 = Abc_MaxInt(iVar2,b);
    iVar4 = Abc_MinInt(iVar2,b);
    iVar3 = ((iVar3 - iVar4) + iVar2 + b) - uVar1;
    if (((1 < iVar2) && (1 < b)) && (iVar3 < Size)) {
      iValueBest = iVarBest;
      Size0 = iVar2;
      Size = iVar3;
    }
  }
  pAVar7 = Saig_ManLo(pAig,iValueBest);
  uVar5 = Aig_ObjId(pAVar7);
  printf("BestVar = %4d/%4d.  Value =%6d.  Orig =%6d. Size0 =%6d. ",(ulong)(uint)iValueBest,
         (ulong)uVar5,(ulong)(uint)Size,(ulong)uVar1,(ulong)(uint)Size0);
  aVar9 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar9 - aVar6);
  return iValueBest;
}

Assistant:

int Llb_NonlinFindBestVar( DdManager * dd, DdNode * bFunc, Aig_Man_t * pAig )
{
    int fVerbose = 0;
    Aig_Obj_t * pObj;
    DdNode * bCof, * bVar;
    int i, iVar, iVarBest = -1, iValue, iValueBest = ABC_INFINITY, Size0Best = -1;
    int Size, Size0, Size1;
    abctime clk = Abc_Clock();
    Size = Cudd_DagSize(bFunc);
//    printf( "Original = %6d.  SuppSize = %3d. Vars = %3d.\n", 
//        Size = Cudd_DagSize(bFunc), Cudd_SupportSize(dd, bFunc), Aig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        iVar = Aig_ObjId(pObj);

if ( fVerbose )
printf( "Var =%3d : ", iVar );
        bVar = Cudd_bddIthVar(dd, iVar);

        bCof = Cudd_bddAnd( dd, bFunc, Cudd_Not(bVar) );          Cudd_Ref( bCof );
        Size0 = Cudd_DagSize(bCof);
if ( fVerbose )
printf( "Supp0 =%3d  ",  Cudd_SupportSize(dd, bCof) );
if ( fVerbose )
printf( "Size0 =%6d   ", Size0 );
        Cudd_RecursiveDeref( dd, bCof );

        bCof = Cudd_bddAnd( dd, bFunc, bVar );                    Cudd_Ref( bCof );
        Size1 = Cudd_DagSize(bCof);
if ( fVerbose )
printf( "Supp1 =%3d  ",  Cudd_SupportSize(dd, bCof) );
if ( fVerbose )
printf( "Size1 =%6d   ", Size1 );
        Cudd_RecursiveDeref( dd, bCof );

        iValue = Abc_MaxInt(Size0, Size1) - Abc_MinInt(Size0, Size1) + Size0 + Size1 - Size;
if ( fVerbose )
printf( "D =%6d  ", Size0 + Size1 - Size );
if ( fVerbose )
printf( "B =%6d  ", Abc_MaxInt(Size0, Size1) - Abc_MinInt(Size0, Size1) );
if ( fVerbose )
printf( "S =%6d\n", iValue );
        if ( Size0 > 1 && Size1 > 1 && iValueBest > iValue )
        {
            iValueBest = iValue;
            iVarBest   = i;
            Size0Best  = Size0;
        }
    }
    printf( "BestVar = %4d/%4d.  Value =%6d.  Orig =%6d. Size0 =%6d. ", 
        iVarBest, Aig_ObjId(Saig_ManLo(pAig,iVarBest)), iValueBest, Size, Size0Best );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return iVarBest;
}